

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

void __thiscall helics::apps::Connector::processArgs(Connector *this)

{
  undefined1 this_00 [8];
  allocator<char> local_51;
  undefined1 local_50 [8];
  string local_48;
  string local_28;
  
  generateParser((Connector *)local_50);
  if ((this->super_App).deactivated == false) {
    helicsCLI11App::
    helics_parse<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
              ((helicsCLI11App *)local_50,&(this->super_App).remArgs);
  }
  else if ((this->super_App).helpMode == true) {
    helicsCLI11App::remove_helics_specifics((helicsCLI11App *)local_50);
    this_00 = local_50;
    std::__cxx11::string::string<std::allocator<char>>((string *)(local_50 + 8),"",&local_51);
    CLI::App::help(&local_28,(App *)this_00,(string *)(local_50 + 8),Normal);
    std::operator<<((ostream *)&std::cout,(string *)&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    std::__cxx11::string::~string((string *)(local_50 + 8));
  }
  if (local_50 != (undefined1  [8])0x0) {
    (*((App *)local_50)->_vptr_App[1])();
  }
  return;
}

Assistant:

void Connector::processArgs()
{
    auto app = generateParser();

    if (!deactivated) {
        app->helics_parse(remArgs);
    } else if (helpMode) {
        app->remove_helics_specifics();
        std::cout << app->help();
    }
}